

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

QVariant * __thiscall QListModel::data(QListModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  int iVar2;
  QList<QListWidgetItem_*> *this_00;
  qsizetype qVar3;
  long i;
  const_reference ppQVar4;
  uint in_ECX;
  QModelIndex *in_RDX;
  long in_RSI;
  QVariant *in_RDI;
  QModelIndex *in_stack_ffffffffffffffc0;
  
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffffc0);
  if (bVar1) {
    iVar2 = QModelIndex::row(in_RDX);
    this_00 = (QList<QListWidgetItem_*> *)(long)iVar2;
    qVar3 = QList<QListWidgetItem_*>::size((QList<QListWidgetItem_*> *)(in_RSI + 0x10));
    if ((long)this_00 < qVar3) {
      i = in_RSI + 0x10;
      QModelIndex::row(in_RDX);
      ppQVar4 = QList<QListWidgetItem_*>::at(this_00,i);
      (*(*ppQVar4)->_vptr_QListWidgetItem[3])(in_RDI,*ppQVar4,(ulong)in_ECX);
      return in_RDI;
    }
  }
  ::QVariant::QVariant((QVariant *)0x89a4b8);
  return in_RDI;
}

Assistant:

QVariant QListModel::data(const QModelIndex &index, int role) const
{
    if (!index.isValid() || index.row() >= items.size())
        return QVariant();
    return items.at(index.row())->data(role);
}